

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O2

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFAbbreviationDeclaration::getAttributeValue
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFAbbreviationDeclaration *this
          ,uint64_t DIEOffset,Attribute Attr,DWARFUnit *U)

{
  DataExtractor DebugInfoData_00;
  bool bVar1;
  uint *puVar2;
  long *plVar3;
  int64_t V;
  uint uVar4;
  AttributeSpec *this_00;
  long lVar5;
  Optional<long> OVar6;
  undefined1 auStack_a0 [8];
  DWARFDataExtractor DebugInfoData;
  DWARFFormValue FormValue;
  Optional<unsigned_int> MatchAttrIndex;
  uint64_t Offset;
  
  FormValue.C = (DWARFContext *)findAttributeIndex(this,Attr);
  if (((ulong)FormValue.C >> 0x20 & 1) != 0) {
    DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)auStack_a0,U);
    MatchAttrIndex.Storage = (OptionalStorage<unsigned_int,_true>)(this->CodeByteSize + DIEOffset);
    this_00 = (AttributeSpec *)
              (this->AttributeSpecs).
              super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
              super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
              .
              super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
              .super_SmallVectorBase.BeginX;
    uVar4 = 0;
    for (lVar5 = (ulong)(this->AttributeSpecs).
                        super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                        super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                        .
                        super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                        .super_SmallVectorBase.Size << 4; lVar5 != 0; lVar5 = lVar5 + -0x10) {
      puVar2 = optional_detail::OptionalStorage<unsigned_int,_true>::getValue
                         ((OptionalStorage<unsigned_int,_true> *)&FormValue.C);
      if (uVar4 == *puVar2) {
        if (this_00->Form == DW_FORM_implicit_const) {
          V = AttributeSpec::getImplicitConstValue(this_00);
          DWARFFormValue::createFromSValue(DW_FORM_implicit_const,V);
LAB_00b19561:
          (__return_storage_ptr__->Storage).hasVal = true;
          return __return_storage_ptr__;
        }
        DebugInfoData.Section = (DWARFSection *)CONCAT62(DebugInfoData.Section._2_6_,this_00->Form);
        FormValue.Form = 0;
        FormValue._2_6_ = 0;
        FormValue.Value.field_0.uval = 0;
        FormValue.Value.SectionIndex = 0;
        FormValue.U = (DWARFUnit *)0x0;
        bVar1 = DWARFFormValue::extractValue
                          ((DWARFFormValue *)&DebugInfoData.Section,(DWARFDataExtractor *)auStack_a0
                           ,(uint64_t *)&MatchAttrIndex,(U->Header).FormParams,U);
        if (bVar1) {
          (__return_storage_ptr__->Storage).field_0.value.U =
               (DWARFUnit *)FormValue.Value.SectionIndex;
          (__return_storage_ptr__->Storage).field_0.value.C = (DWARFContext *)FormValue.U;
          (__return_storage_ptr__->Storage).field_0.value.Value.data =
               (uint8_t *)FormValue.Value.field_0;
          (__return_storage_ptr__->Storage).field_0.value.Value.SectionIndex =
               (uint64_t)FormValue.Value.data;
          *(DWARFSection **)&(__return_storage_ptr__->Storage).field_0 = DebugInfoData.Section;
          (__return_storage_ptr__->Storage).field_0.value.Value.field_0 =
               (anon_union_8_3_82d75f4a_for_ValueType_0)FormValue._0_8_;
          goto LAB_00b19561;
        }
      }
      OVar6 = AttributeSpec::getByteSize(this_00,U);
      DebugInfoData.Section = (DWARFSection *)OVar6.Storage.field_0;
      FormValue.Form._0_1_ = OVar6.Storage.hasVal;
      if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        DebugInfoData_00.Data.Length = (size_t)DebugInfoData.super_DataExtractor.Data.Data;
        DebugInfoData_00.Data.Data = (char *)auStack_a0;
        DebugInfoData_00.IsLittleEndian = (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
        DebugInfoData_00.AddressSize = DebugInfoData.super_DataExtractor.Data.Length._1_1_;
        DebugInfoData_00._18_6_ = DebugInfoData.super_DataExtractor.Data.Length._2_6_;
        DWARFFormValue::skipValue
                  (this_00->Form,DebugInfoData_00,(uint64_t *)&MatchAttrIndex,(U->Header).FormParams
                  );
      }
      else {
        plVar3 = optional_detail::OptionalStorage<long,_true>::getValue
                           ((OptionalStorage<long,_true> *)&DebugInfoData.Section);
        MatchAttrIndex.Storage = MatchAttrIndex.Storage + *plVar3;
      }
      uVar4 = uVar4 + 1;
      this_00 = this_00 + 1;
    }
  }
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue> DWARFAbbreviationDeclaration::getAttributeValue(
    const uint64_t DIEOffset, const dwarf::Attribute Attr,
    const DWARFUnit &U) const {
  Optional<uint32_t> MatchAttrIndex = findAttributeIndex(Attr);
  if (!MatchAttrIndex)
    return None;

  auto DebugInfoData = U.getDebugInfoExtractor();

  // Add the byte size of ULEB that for the abbrev Code so we can start
  // skipping the attribute data.
  uint64_t Offset = DIEOffset + CodeByteSize;
  uint32_t AttrIndex = 0;
  for (const auto &Spec : AttributeSpecs) {
    if (*MatchAttrIndex == AttrIndex) {
      // We have arrived at the attribute to extract, extract if from Offset.
      if (Spec.isImplicitConst())
        return DWARFFormValue::createFromSValue(Spec.Form,
                                                Spec.getImplicitConstValue());

      DWARFFormValue FormValue(Spec.Form);
      if (FormValue.extractValue(DebugInfoData, &Offset, U.getFormParams(), &U))
        return FormValue;
    }
    // March Offset along until we get to the attribute we want.
    if (auto FixedSize = Spec.getByteSize(U))
      Offset += *FixedSize;
    else
      DWARFFormValue::skipValue(Spec.Form, DebugInfoData, &Offset,
                                U.getFormParams());
    ++AttrIndex;
  }
  return None;
}